

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Minisat::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  uint64_t *puVar1;
  vec<unsigned_int> *pvVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  vec<unsigned_int> *pvVar6;
  uint in_EAX;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar11;
  int iVar12;
  int iVar13;
  int i;
  undefined8 uStack_38;
  int iVar10;
  
  if (this->n_touched != 0) {
    iVar8 = 0;
    iVar9 = (this->subsumption_queue).end;
    iVar12 = (this->subsumption_queue).buf.sz;
    iVar7 = (this->subsumption_queue).first;
    iVar13 = iVar9 - iVar7;
    iVar10 = 0;
    if (iVar9 < iVar7) {
      iVar10 = iVar12;
    }
    iVar9 = iVar10 + iVar13;
    if (iVar9 != 0 && SCARRY4(iVar10,iVar13) == iVar9 < 0) {
      do {
        uVar3 = (this->subsumption_queue).buf.data[(iVar7 + iVar8) % iVar12];
        puVar4 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        uVar5 = *(ulong *)(puVar4 + uVar3);
        if ((uVar5 & 3) == 0) {
          *(ulong *)(puVar4 + uVar3) = uVar5 | 2;
        }
        iVar8 = iVar8 + 1;
        iVar10 = (this->subsumption_queue).end;
        iVar12 = (this->subsumption_queue).buf.sz;
        iVar7 = (this->subsumption_queue).first;
        iVar9 = 0;
        if (iVar10 < iVar7) {
          iVar9 = iVar12;
        }
        iVar9 = (iVar10 - iVar7) + iVar9;
      } while (iVar8 < iVar9);
    }
    puVar1 = &(this->super_Solver).statistics.simpSteps;
    *puVar1 = *puVar1 + (long)iVar9;
    uStack_38 = (ulong)in_EAX;
    if (0 < (this->touched).sz) {
      iVar9 = 0;
      do {
        if ((this->touched).data[iVar9] != '\0') {
          if ((this->occurs).dirty.data[iVar9] != '\0') {
            OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clean
                      (&this->occurs,(int *)((long)&uStack_38 + 4));
          }
          pvVar6 = (this->occurs).occs.data;
          pvVar2 = pvVar6 + uStack_38._4_4_;
          if (0 < pvVar6[uStack_38._4_4_].sz) {
            lVar11 = 0;
            do {
              if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory
                   [pvVar2->data[lVar11]] & 3) == 0) {
                Queue<unsigned_int>::insert(&this->subsumption_queue,pvVar2->data[lVar11]);
                puVar4 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
                *(ulong *)(puVar4 + pvVar2->data[lVar11]) =
                     *(ulong *)(puVar4 + pvVar2->data[lVar11]) & 0xfffffffffffffffc | 2;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < pvVar2->sz);
          }
          (this->touched).data[uStack_38._4_4_] = '\0';
          puVar1 = &(this->super_Solver).statistics.simpSteps;
          *puVar1 = *puVar1 + (long)pvVar2->sz;
        }
        iVar9 = uStack_38._4_4_ + 1;
        uStack_38 = CONCAT44(iVar9,(undefined4)uStack_38);
      } while (iVar9 < (this->touched).sz);
    }
    iVar8 = 0;
    iVar9 = (this->subsumption_queue).end;
    iVar12 = (this->subsumption_queue).buf.sz;
    iVar7 = (this->subsumption_queue).first;
    iVar13 = iVar9 - iVar7;
    iVar10 = 0;
    if (iVar9 < iVar7) {
      iVar10 = iVar12;
    }
    iVar9 = iVar10 + iVar13;
    if (iVar9 != 0 && SCARRY4(iVar10,iVar13) == iVar9 < 0) {
      do {
        uVar3 = (this->subsumption_queue).buf.data[(iVar7 + iVar8) % iVar12];
        puVar4 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        uVar5 = *(ulong *)(puVar4 + uVar3);
        if (((uint)uVar5 & 3) == 2) {
          *(ulong *)(puVar4 + uVar3) = uVar5 & 0xfffffffffffffffc;
        }
        iVar8 = iVar8 + 1;
        iVar10 = (this->subsumption_queue).end;
        iVar12 = (this->subsumption_queue).buf.sz;
        iVar7 = (this->subsumption_queue).first;
        iVar9 = 0;
        if (iVar10 < iVar7) {
          iVar9 = iVar12;
        }
        iVar9 = (iVar10 - iVar7) + iVar9;
      } while (iVar8 < iVar9);
    }
    puVar1 = &(this->super_Solver).statistics.simpSteps;
    *puVar1 = *puVar1 + (long)iVar9;
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i, j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0) ca[subsumption_queue[i]].mark(2);
    statistics.simpSteps += subsumption_queue.size();

    for (i = 0; i < touched.size(); i++)
        if (touched[i]) {
            const vec<CRef> &cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0) {
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
            statistics.simpSteps += cs.size();
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2) ca[subsumption_queue[i]].mark(0);
    statistics.simpSteps += subsumption_queue.size();

    n_touched = 0;
}